

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_validation.cpp
# Opt level: O0

XrResult CoreValidationXrSetDebugUtilsObjectNameEXT
                   (XrInstance instance,XrDebugUtilsObjectNameInfoEXT *nameInfo)

{
  XrObjectType object_type;
  uint64_t object_handle;
  char *pcVar1;
  allocator local_79;
  string local_78 [40];
  GenValidUsageXrInstanceInfo *gen_instance_info;
  pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*> info_with_lock;
  XrResult result;
  XrDebugUtilsObjectNameInfoEXT *nameInfo_local;
  XrInstance instance_local;
  
  instance_local._4_4_ = GenValidUsageInputsXrSetDebugUtilsObjectNameEXT(instance,nameInfo);
  if ((instance_local._4_4_ == XR_SUCCESS) &&
     (instance_local._4_4_ = GenValidUsageNextXrSetDebugUtilsObjectNameEXT(instance,nameInfo),
     instance_local._4_4_ == XR_SUCCESS)) {
    HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::getWithLock
              ((pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*> *)
               &gen_instance_info,
               &g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
               instance);
    local_78[0x20] = (string)info_with_lock.first._M_owns;
    local_78[0x21] = (string)info_with_lock.first._9_1_;
    local_78[0x22] = (string)info_with_lock.first._10_1_;
    local_78[0x23] = (string)info_with_lock.first._11_1_;
    local_78[0x24] = (string)info_with_lock.first._12_1_;
    local_78[0x25] = (string)info_with_lock.first._13_1_;
    local_78[0x26] = (string)info_with_lock.first._14_1_;
    local_78[0x27] = (string)info_with_lock.first._15_1_;
    if (info_with_lock.first._8_8_ != 0) {
      object_handle = nameInfo->objectHandle;
      object_type = nameInfo->objectType;
      pcVar1 = nameInfo->objectName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar1,&local_79);
      DebugUtilsData::AddObjectName
                ((DebugUtilsData *)(info_with_lock.first._8_8_ + 0x40),object_handle,object_type,
                 (string *)local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    std::pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*>::~pair
              ((pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*> *)
               &gen_instance_info);
  }
  return instance_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL CoreValidationXrSetDebugUtilsObjectNameEXT(XrInstance instance,
                                                                          const XrDebugUtilsObjectNameInfoEXT *nameInfo) {
    try {
        XrResult result = GenValidUsageInputsXrSetDebugUtilsObjectNameEXT(instance, nameInfo);
        if (!XR_UNQUALIFIED_SUCCESS(result)) {
            return result;
        }
        result = GenValidUsageNextXrSetDebugUtilsObjectNameEXT(instance, nameInfo);
        if (!XR_UNQUALIFIED_SUCCESS(result)) {
            return result;
        }
        auto info_with_lock = g_instance_info.getWithLock(instance);
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_lock.second;
        if (nullptr != gen_instance_info) {
            gen_instance_info->debug_data.AddObjectName(nameInfo->objectHandle, nameInfo->objectType, nameInfo->objectName);
        }
        return result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}